

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::StairsRenderer<ImPlot::GetterYs<float>,_ImPlot::TransformerLogLog>::operator()
          (StairsRenderer<ImPlot::GetterYs<float>,_ImPlot::TransformerLogLog> *this,
          ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  float *pfVar1;
  float fVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  ImVec2 IVar7;
  int iVar8;
  ImU32 IVar9;
  GetterYs<float> *pGVar10;
  TransformerLogLog *pTVar11;
  ImPlotPlot *pIVar12;
  ImDrawVert *pIVar13;
  uint *puVar14;
  ImPlotContext *pIVar15;
  bool bVar16;
  double dVar17;
  double dVar18;
  ImVec2 IVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  
  pIVar15 = GImPlot;
  pGVar10 = this->Getter;
  pTVar11 = this->Transformer;
  iVar8 = pGVar10->Count;
  fVar2 = *(float *)((long)pGVar10->Ys +
                    (long)(((prim + 1 + pGVar10->Offset) % iVar8 + iVar8) % iVar8) *
                    (long)pGVar10->Stride);
  dVar17 = log10(((double)(prim + 1) * pGVar10->XScale + pGVar10->X0) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  dVar3 = pIVar15->LogDenX;
  pIVar12 = pIVar15->CurrentPlot;
  dVar4 = (pIVar12->XAxis).Range.Min;
  dVar5 = (pIVar12->XAxis).Range.Max;
  dVar18 = log10((double)fVar2 / pIVar12->YAxis[pTVar11->YAxis].Range.Min);
  iVar8 = pTVar11->YAxis;
  pIVar12 = pIVar15->CurrentPlot;
  dVar6 = pIVar12->YAxis[iVar8].Range.Min;
  IVar19.x = (float)((((double)(float)(dVar17 / dVar3) * (dVar5 - dVar4) + dVar4) -
                     (pIVar12->XAxis).Range.Min) * pIVar15->Mx +
                    (double)pIVar15->PixelRange[iVar8].Min.x);
  fVar20 = (float)((((double)(float)(dVar18 / pIVar15->LogDenY[iVar8]) *
                     (pIVar12->YAxis[iVar8].Range.Max - dVar6) + dVar6) - dVar6) *
                   pIVar15->My[iVar8] + (double)pIVar15->PixelRange[iVar8].Min.y);
  fVar2 = (this->P1).x;
  fVar21 = (this->P1).y;
  fVar22 = fVar21;
  if (fVar20 <= fVar21) {
    fVar22 = fVar20;
  }
  bVar16 = false;
  if ((fVar22 < (cull_rect->Max).y) &&
     (fVar21 = (float)(-(uint)(fVar20 <= fVar21) & (uint)fVar21 |
                      ~-(uint)(fVar20 <= fVar21) & (uint)fVar20), pfVar1 = &(cull_rect->Min).y,
     bVar16 = false, *pfVar1 <= fVar21 && fVar21 != *pfVar1)) {
    fVar21 = fVar2;
    if (IVar19.x <= fVar2) {
      fVar21 = IVar19.x;
    }
    if (fVar21 < (cull_rect->Max).x) {
      fVar21 = (float)(~-(uint)(IVar19.x <= fVar2) & (uint)IVar19.x |
                      -(uint)(IVar19.x <= fVar2) & (uint)fVar2);
      bVar16 = (cull_rect->Min).x <= fVar21 && fVar21 != (cull_rect->Min).x;
    }
  }
  if (bVar16 != false) {
    fVar21 = (this->P1).y;
    fVar22 = fVar21 + this->HalfWeight;
    fVar21 = fVar21 - this->HalfWeight;
    IVar9 = this->Col;
    IVar7 = *uv;
    pIVar13 = DrawList->_VtxWritePtr;
    (pIVar13->pos).x = fVar2;
    (pIVar13->pos).y = fVar22;
    DrawList->_VtxWritePtr->uv = IVar7;
    pIVar13 = DrawList->_VtxWritePtr;
    pIVar13->col = IVar9;
    pIVar13[1].pos.x = IVar19.x;
    pIVar13[1].pos.y = fVar21;
    DrawList->_VtxWritePtr[1].uv = IVar7;
    pIVar13 = DrawList->_VtxWritePtr;
    pIVar13[1].col = IVar9;
    pIVar13[2].pos.x = fVar2;
    pIVar13[2].pos.y = fVar21;
    pIVar13[2].uv = IVar7;
    pIVar13 = DrawList->_VtxWritePtr;
    pIVar13[2].col = IVar9;
    pIVar13[3].pos.x = IVar19.x;
    pIVar13[3].pos.y = fVar22;
    pIVar13[3].uv = IVar7;
    pIVar13 = DrawList->_VtxWritePtr;
    pIVar13[3].col = IVar9;
    DrawList->_VtxWritePtr = pIVar13 + 4;
    puVar14 = DrawList->_IdxWritePtr;
    *puVar14 = DrawList->_VtxCurrentIdx;
    puVar14[1] = DrawList->_VtxCurrentIdx + 1;
    puVar14[2] = DrawList->_VtxCurrentIdx + 2;
    puVar14[3] = DrawList->_VtxCurrentIdx;
    puVar14[4] = DrawList->_VtxCurrentIdx + 1;
    puVar14[5] = DrawList->_VtxCurrentIdx + 3;
    DrawList->_IdxWritePtr = puVar14 + 6;
    DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 4;
    fVar22 = IVar19.x - this->HalfWeight;
    fVar21 = this->HalfWeight + IVar19.x;
    fVar2 = (this->P1).y;
    IVar9 = this->Col;
    IVar7 = *uv;
    pIVar13[4].pos.x = fVar22;
    pIVar13[4].pos.y = fVar20;
    DrawList->_VtxWritePtr->uv = IVar7;
    pIVar13 = DrawList->_VtxWritePtr;
    pIVar13->col = IVar9;
    pIVar13[1].pos.x = fVar21;
    pIVar13[1].pos.y = fVar2;
    DrawList->_VtxWritePtr[1].uv = IVar7;
    pIVar13 = DrawList->_VtxWritePtr;
    pIVar13[1].col = IVar9;
    pIVar13[2].pos.x = fVar22;
    pIVar13[2].pos.y = fVar2;
    pIVar13[2].uv = IVar7;
    pIVar13 = DrawList->_VtxWritePtr;
    pIVar13[2].col = IVar9;
    pIVar13[3].pos.x = fVar21;
    pIVar13[3].pos.y = fVar20;
    pIVar13[3].uv = IVar7;
    pIVar13 = DrawList->_VtxWritePtr;
    pIVar13[3].col = IVar9;
    DrawList->_VtxWritePtr = pIVar13 + 4;
    puVar14 = DrawList->_IdxWritePtr;
    *puVar14 = DrawList->_VtxCurrentIdx;
    puVar14[1] = DrawList->_VtxCurrentIdx + 1;
    puVar14[2] = DrawList->_VtxCurrentIdx + 2;
    puVar14[3] = DrawList->_VtxCurrentIdx;
    puVar14[4] = DrawList->_VtxCurrentIdx + 1;
    puVar14[5] = DrawList->_VtxCurrentIdx + 3;
    DrawList->_IdxWritePtr = puVar14 + 6;
    DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 4;
  }
  IVar19.y = fVar20;
  this->P1 = IVar19;
  return bVar16;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P2 = Transformer(Getter(prim + 1));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2)))) {
            P1 = P2;
            return false;
        }
        AddRectFilled(ImVec2(P1.x, P1.y + HalfWeight), ImVec2(P2.x, P1.y - HalfWeight), Col, DrawList, uv);
        AddRectFilled(ImVec2(P2.x - HalfWeight, P2.y), ImVec2(P2.x + HalfWeight, P1.y), Col, DrawList, uv);

        // AddLine(P1, P12, Weight, Col, DrawList, uv);
        // AddLine(P12, P2, Weight, Col, DrawList, uv);
        P1 = P2;
        return true;
    }